

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

bool __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  uint index;
  
  pcVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  if ((address < pcVar1) ||
     (pcVar1 + ((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount -
               (ulong)(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                      secondaryAllocPageCount) * 0x1000 <= address)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.h"
                       ,0x14b,"(this->IsInSegment(address))","this->IsInSegment(address)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  index = (uint)((int)address -
                *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address)
          >> 0xc;
  BVar4 = BVStatic<272UL>::TestRange(&this->decommitPages,index,pageCount);
  bVar3 = true;
  if (BVar4 == '\0') {
    BVar4 = BVStatic<272UL>::TestRange(&this->freePages,index,pageCount);
    bVar3 = BVar4 != '\0';
  }
  return bVar3;
}

Assistant:

bool IsFreeOrDecommitted(void* address, uint pageCount) const
    {
        Assert(this->IsInSegment(address));

        uint base = GetBitRangeBase(address);
        return this->TestRangeInDecommitPagesBitVector(base, pageCount) || this->TestRangeInFreePagesBitVector(base, pageCount);
    }